

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O1

void __thiscall FSharedStringArena::FreeAll(FSharedStringArena *this)

{
  Block *pBVar1;
  Block *pBVar2;
  Block *pBVar3;
  Node *string;
  Block *pBVar4;
  
  pBVar3 = (this->super_FMemArena).TopBlock;
  while (pBVar3 != (Block *)0x0) {
    pBVar1 = pBVar3->NextBlock;
    pBVar2 = (Block *)pBVar3->Avail;
    pBVar4 = pBVar3 + 0x18;
    pBVar3->Avail = pBVar4;
    for (; pBVar4 < pBVar2; pBVar4 = pBVar4 + 1) {
      FString::~FString((FString *)&pBVar4->Limit);
    }
    pBVar3->NextBlock = (this->super_FMemArena).FreeBlocks;
    (this->super_FMemArena).FreeBlocks = pBVar3;
    pBVar3 = pBVar1;
  }
  memset(this->Buckets,0,0x800);
  (this->super_FMemArena).TopBlock = (Block *)0x0;
  return;
}

Assistant:

void FSharedStringArena::FreeAll()
{
	for (Block *next, *block = TopBlock; block != NULL; block = next)
	{
		next = block->NextBlock;
		void *limit = block->Avail;
		block->Reset();
		for (Node *string = (Node *)block->Avail; string < limit; ++string)
		{
			string->~Node();
		}
		block->NextBlock = FreeBlocks;
		FreeBlocks = block;
	}
	memset(Buckets, 0, sizeof(Buckets));
	TopBlock = NULL;
}